

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControl::QWidgetTextControl(QWidgetTextControl *this,QTextDocument *doc,QObject *parent)

{
  long lVar1;
  QObjectPrivate *pQVar2;
  QWidgetTextControlPrivate *this_00;
  QObject *in_RDX;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControlPrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QObjectPrivate *)operator_new(0x1b0);
  QWidgetTextControlPrivate::QWidgetTextControlPrivate(in_RDI);
  QInputControl::QInputControl((QInputControl *)in_RDI,TextEdit,pQVar2,in_RDX);
  *(undefined ***)in_RDI = &PTR_metaObject_00d1ff90;
  this_00 = d_func((QWidgetTextControl *)0x7134e9);
  QString::QString((QString *)0x713507);
  QWidgetTextControlPrivate::init(this_00,(EVP_PKEY_CTX *)0x1);
  QString::~QString((QString *)0x713529);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetTextControl::QWidgetTextControl(QTextDocument *doc, QObject *parent)
    : QInputControl(QInputControl::TextEdit, *new QWidgetTextControlPrivate, parent)
{
    Q_D(QWidgetTextControl);
    d->init(Qt::RichText, QString(), doc);
}